

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O1

int __thiscall PyServerDMLSession::close(PyServerDMLSession *this,int __fd)

{
  int extraout_EAX;
  function overload;
  object o;
  gil_scoped_acquire gil;
  object local_30;
  int local_24;
  object local_20;
  gil_scoped_acquire local_18;
  
  local_24 = __fd;
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_18);
  pybind11::get_overload<ki::protocol::net::ServerDMLSession>
            ((pybind11 *)&local_30,&this->super_ServerDMLSession,"close");
  if (local_30.super_handle.m_ptr == (PyObject *)0x0) {
    pybind11::object::~object(&local_30);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_18);
  }
  else {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_20,(SessionCloseErrorCode *)&local_30);
    pybind11::object::~object(&local_20);
    pybind11::object::~object(&local_30);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_18);
    if (local_30.super_handle.m_ptr != (PyObject *)0x0) {
      return extraout_EAX;
    }
  }
  pybind11::pybind11_fail
            ("Tried to call pure virtual function \"ki::protocol::net::ServerDMLSession::close\"");
}

Assistant:

void close(ki::protocol::net::SessionCloseErrorCode error) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ServerDMLSession,
            close, error);
    }